

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

bool FinalizeAndExtractPSBT(PartiallySignedTransaction *psbtx,CMutableTransaction *result)

{
  long lVar1;
  pointer pCVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = FinalizePSBT(psbtx);
  if (bVar3) {
    CMutableTransaction::operator=(result,(CMutableTransaction *)psbtx);
    uVar4 = 0;
    while( true ) {
      uVar5 = (ulong)uVar4;
      pCVar2 = (result->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(result->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68) <= uVar5) break;
      prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                (&pCVar2[uVar5].scriptSig.super_CScriptBase,
                 &(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5].final_script_sig.super_CScriptBase);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator=(&(result->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5].scriptWitness.stack,
                  &(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar5].final_script_witness.stack);
      uVar4 = uVar4 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool FinalizeAndExtractPSBT(PartiallySignedTransaction& psbtx, CMutableTransaction& result)
{
    // It's not safe to extract a PSBT that isn't finalized, and there's no easy way to check
    //   whether a PSBT is finalized without finalizing it, so we just do this.
    if (!FinalizePSBT(psbtx)) {
        return false;
    }

    result = *psbtx.tx;
    for (unsigned int i = 0; i < result.vin.size(); ++i) {
        result.vin[i].scriptSig = psbtx.inputs[i].final_script_sig;
        result.vin[i].scriptWitness = psbtx.inputs[i].final_script_witness;
    }
    return true;
}